

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_command * nk__next(nk_context *ctx,nk_command *cmd)

{
  nk_command *next;
  nk_byte *buffer;
  nk_command *cmd_local;
  nk_context *ctx_local;
  
  if (ctx != (nk_context *)0x0) {
    if (((ctx == (nk_context *)0x0) || (cmd == (nk_command *)0x0)) || (ctx->count == 0)) {
      ctx_local = (nk_context *)0x0;
    }
    else if (cmd->next < (ctx->memory).allocated) {
      ctx_local = (nk_context *)((long)(ctx->memory).memory.ptr + cmd->next);
    }
    else {
      ctx_local = (nk_context *)0x0;
    }
    return (nk_command *)ctx_local;
  }
  __assert_fail("ctx",
                "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h",
                0x3bbd,
                "const struct nk_command *nk__next(struct nk_context *, const struct nk_command *)")
  ;
}

Assistant:

NK_API const struct nk_command*
nk__next(struct nk_context *ctx, const struct nk_command *cmd)
{
    nk_byte *buffer;
    const struct nk_command *next;
    NK_ASSERT(ctx);
    if (!ctx || !cmd || !ctx->count) return 0;
    if (cmd->next >= ctx->memory.allocated) return 0;
    buffer = (nk_byte*)ctx->memory.memory.ptr;
    next = nk_ptr_add_const(struct nk_command, buffer, cmd->next);
    return next;
}